

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtmf.c
# Opt level: O0

void usage(char *selfname)

{
  undefined8 in_RDI;
  
  fprintf(_stderr,
          "GHA dtmf example utility, usage: %s <FILE> <OFFSET> <LEN> [<EXPECTED_FREQ_LOW> <EXPECTED_MAGNITUDE_LOW>, <EXPECTED_FREQ_HIGH>, <EXPECTED_MAGNITUDE_HIGH>]\n"
          ,in_RDI);
  fprintf(_stderr,"FILE - input pcm file (raw pcm, mono, 8 bit, 8000 kHz\n");
  fprintf(_stderr,"OFFSET - offset in input file, samples\n");
  fprintf(_stderr,"LEN - len to process, samples\n");
  fprintf(_stderr,"Following options are optional used by test framework:\n");
  fprintf(_stderr,"EXPECTED_FREQ_(LOW|HIGH) - expected angular frequency\n");
  fprintf(_stderr,"EXPECTED_MAGNITUDE_(LOW|HIGH) - expected magnitude (0 - 1)\n");
  return;
}

Assistant:

void usage(const char* selfname) {
	fprintf(stderr, "GHA dtmf example utility, usage: %s <FILE> <OFFSET> <LEN> [<EXPECTED_FREQ_LOW> <EXPECTED_MAGNITUDE_LOW>, <EXPECTED_FREQ_HIGH>, <EXPECTED_MAGNITUDE_HIGH>]\n", selfname);
	fprintf(stderr, "FILE - input pcm file (raw pcm, mono, 8 bit, 8000 kHz\n");
	fprintf(stderr, "OFFSET - offset in input file, samples\n");
	fprintf(stderr, "LEN - len to process, samples\n");
	fprintf(stderr, "Following options are optional used by test framework:\n");
	fprintf(stderr, "EXPECTED_FREQ_(LOW|HIGH) - expected angular frequency\n");
	fprintf(stderr, "EXPECTED_MAGNITUDE_(LOW|HIGH) - expected magnitude (0 - 1)\n");
}